

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,FString *head,FString *tail)

{
  size_t sVar1;
  size_t sVar2;
  size_t len2;
  size_t len1;
  FString *tail_local;
  FString *head_local;
  FString *this_local;
  
  sVar1 = Len(head);
  sVar2 = Len(tail);
  AllocBuffer(this,sVar1 + sVar2);
  StrCopy(this->Chars,head);
  StrCopy(this->Chars + sVar1,tail);
  return;
}

Assistant:

FString::FString (const FString &head, const FString &tail)
{
	size_t len1 = head.Len();
	size_t len2 = tail.Len();
	AllocBuffer (len1 + len2);
	StrCopy (Chars, head);
	StrCopy (Chars + len1, tail);
}